

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

numeric * cs_impl::runtime_cs_ext::argument_count(numeric *__return_storage_ptr__,var *func)

{
  bool bVar1;
  int iVar2;
  type_info *ptVar3;
  object_method *poVar4;
  callable *pcVar5;
  function *pfVar6;
  long lVar7;
  cni *pcVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar9;
  allocator local_31;
  uint *local_30;
  long local_28;
  uint local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  ptVar3 = any::type(func);
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&cs::object_method::typeinfo);
  if (bVar1) {
    poVar4 = any::const_val<cs::object_method>(func);
    pcVar5 = any::const_val<cs::callable>(&poVar4->callable);
    ptVar3 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target_type(&pcVar5->mFunc);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&cs::function::typeinfo);
    if (bVar1) {
      pfVar6 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs::function>(&pcVar5->mFunc);
      lVar7 = (long)(pfVar6->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pfVar6->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    else {
      pcVar8 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs_impl::cni>(&pcVar5->mFunc);
      iVar2 = (*pcVar8->mCni->_vptr_cni_holder_base[2])();
      lVar7 = CONCAT44(extraout_var,iVar2);
    }
    lVar7 = lVar7 + -1;
  }
  else {
    ptVar3 = any::type(func);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&cs::callable::typeinfo);
    if (!bVar1) {
      plVar9 = (long *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)&local_30,"Not a function.",&local_31);
      *plVar9 = (long)(plVar9 + 2);
      if (local_30 == &local_20) {
        *(uint *)(plVar9 + 2) = local_20;
        *(undefined4 *)((long)plVar9 + 0x14) = uStack_1c;
        *(undefined4 *)(plVar9 + 3) = uStack_18;
        *(undefined4 *)((long)plVar9 + 0x1c) = uStack_14;
      }
      else {
        *plVar9 = (long)local_30;
        plVar9[2] = CONCAT44(uStack_1c,local_20);
      }
      plVar9[1] = local_28;
      local_28 = 0;
      local_20 = local_20 & 0xffffff00;
      local_30 = &local_20;
      __cxa_throw(plVar9,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    pcVar5 = any::const_val<cs::callable>(func);
    ptVar3 = std::
             function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
             target_type(&pcVar5->mFunc);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&cs::function::typeinfo);
    if (bVar1) {
      pfVar6 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs::function>(&pcVar5->mFunc);
      lVar7 = (long)(pfVar6->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pfVar6->mArgs).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    else {
      pcVar8 = std::
               function<cs_impl::any_(std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>::
               target<cs_impl::cni>(&pcVar5->mFunc);
      iVar2 = (*pcVar8->mCni->_vptr_cni_holder_base[2])();
      lVar7 = CONCAT44(extraout_var_00,iVar2);
    }
  }
  __return_storage_ptr__->type = true;
  (__return_storage_ptr__->data)._int = lVar7;
  return __return_storage_ptr__;
}

Assistant:

numeric argument_count(const var &func)
		{
			if (func.type() == typeid(object_method)) {
				const callable::function_type &target = func.const_val<object_method>().callable.const_val<callable>().get_raw_data();
				if (target.target_type() == typeid(function))
					return target.target<function>()->argument_count() - 1;
				else
					return target.target<cni>()->argument_count() - 1;
			}
			else if (func.type() == typeid(callable)) {
				const callable::function_type &target = func.const_val<callable>().get_raw_data();
				if (target.target_type() == typeid(function))
					return target.target<function>()->argument_count();
				else
					return target.target<cni>()->argument_count();
			}
			else
				throw lang_error("Not a function.");
		}